

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O3

void generateGradientTexture
               (PatternGeneration *pattern_generation,uint *resolution,uint *i,string *textures_dir,
               string *scripts_dir)

{
  char cVar1;
  ostream *poVar2;
  Scalar_ local_1a0 [8];
  Mat gradient_texture;
  int local_140 [2];
  Scalar gradient_color_1;
  undefined1 local_120 [8];
  Scalar gradient_color_2;
  _InputArray local_100;
  void *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  string local_d0;
  string local_b0;
  undefined1 local_90 [8];
  string material_name;
  string img_name;
  string img_filename;
  
  local_90 = (undefined1  [8])&material_name._M_string_length;
  material_name._M_dataplus._M_p = (pointer)0x0;
  material_name._M_string_length._0_1_ = 0;
  material_name.field_2._8_8_ = &img_name._M_string_length;
  img_name._M_dataplus._M_p = (pointer)0x0;
  img_name._M_string_length._0_1_ = 0;
  img_name.field_2._8_8_ = &img_filename._M_string_length;
  img_filename._M_dataplus._M_p = (pointer)0x0;
  img_filename._M_string_length._0_1_ = 0;
  genNames("gradient_",*i,textures_dir,(string *)local_90,
           (string *)((long)&material_name.field_2 + 8),(string *)((long)&img_name.field_2 + 8));
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_90,material_name._M_dataplus._M_p + (long)local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,material_name.field_2._8_8_,
             img_name._M_dataplus._M_p + material_name.field_2._8_8_);
  genScript(&local_d0,&local_b0,scripts_dir);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  PatternGeneration::getRandomColor();
  PatternGeneration::getRandomColor();
  local_100.flags = *resolution;
  PatternGeneration::getGradientTexture
            (local_1a0,(Scalar_ *)pattern_generation,local_140,SUB81(local_120,0));
  local_100.sz.width = 0;
  local_100.sz.height = 0;
  local_100.flags = 0x1010000;
  local_d8 = 0;
  local_e8 = (void *)0x0;
  uStack_e0 = 0;
  local_100.obj = local_1a0;
  cVar1 = cv::imwrite((string *)(img_name.field_2._M_local_buf + 8),&local_100,(vector *)&local_e8);
  if (local_e8 != (void *)0x0) {
    operator_delete(local_e8);
  }
  if (cVar1 != '\0') {
    cv::Mat::~Mat((Mat *)local_1a0);
    if ((size_type *)img_name.field_2._8_8_ != &img_filename._M_string_length) {
      operator_delete((void *)img_name.field_2._8_8_);
    }
    if ((size_type *)material_name.field_2._8_8_ != &img_name._M_string_length) {
      operator_delete((void *)material_name.field_2._8_8_);
    }
    if (local_90 != (undefined1  [8])&material_name._M_string_length) {
      operator_delete((void *)local_90);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[ERROR] Could not save ",0x17);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)img_name.field_2._8_8_,
                      (long)img_filename._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,". Please ensure the destination folder exists!",0x2e);
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(1);
}

Assistant:

void generateGradientTexture(PatternGeneration & pattern_generation,
    unsigned int & resolution,
    const unsigned int & i,
    std::string & textures_dir,
    std::string & scripts_dir)
{
    std::string material_name, img_name, img_filename;
    genNames("gradient_", i, textures_dir, material_name, img_name, img_filename);
    genScript(material_name, img_name, scripts_dir);
    if (!GENERATE_IMG) return;

    cv::Scalar gradient_color_1 = pattern_generation.getRandomColor();
    cv::Scalar gradient_color_2 = pattern_generation.getRandomColor();
    cv::Mat gradient_texture = pattern_generation.getGradientTexture(gradient_color_1, gradient_color_2, resolution, false);

    if (!cv::imwrite(img_filename, gradient_texture)){
    std::cout << "[ERROR] Could not save " << img_filename <<
        ". Please ensure the destination folder exists!" << std::endl;
        exit(EXIT_FAILURE);
    }

    if (SHOW_IMGS)
        cv::imshow("Gradient texture", gradient_texture);
}